

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O2

entry * __thiscall
cppcms::url_mapper::data::get_entry
          (data *this,string_key *key,size_t params_no,string_key *full_url)

{
  const_iterator cVar1;
  const_iterator cVar2;
  cppcms_error *pcVar3;
  size_t params_no_local;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  params_no_local = params_no;
  cVar1 = std::
          _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>,_std::_Select1st<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::map<unsigned_long,_cppcms::url_mapper::data::entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>_>_>_>
          ::find(&(this->by_key)._M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->by_key)._M_t._M_impl.super__Rb_tree_header) {
    pcVar3 = (cppcms_error *)__cxa_allocate_exception(0x30);
    string_key::str_abi_cxx11_(&local_c8,key);
    std::operator+(&local_a8,"url_mapper: key `",&local_c8);
    std::operator+(&local_88,&local_a8,"\' not found for url `");
    string_key::str_abi_cxx11_(&local_e8,full_url);
    std::operator+(&local_68,&local_88,&local_e8);
    std::operator+(&local_48,&local_68,"\'");
    cppcms_error::cppcms_error(pcVar3,&local_48);
    __cxa_throw(pcVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  cVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>,_std::_Select1st<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
          ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>,_std::_Select1st<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cppcms::url_mapper::data::entry>_>_>
                  *)&cVar1._M_node[2]._M_left,&params_no_local);
  if (cVar2._M_node != (_Base_ptr)&cVar1._M_node[2]._M_right) {
    return (entry *)&cVar2._M_node[1]._M_parent;
  }
  pcVar3 = (cppcms_error *)__cxa_allocate_exception(0x30);
  string_key::str_abi_cxx11_(&local_c8,key);
  std::operator+(&local_a8,"url_mapper: invalid number of parameters for ",&local_c8);
  std::operator+(&local_88,&local_a8,"in url `");
  string_key::str_abi_cxx11_(&local_e8,full_url);
  std::operator+(&local_68,&local_88,&local_e8);
  std::operator+(&local_48,&local_68,"\'");
  cppcms_error::cppcms_error(pcVar3,&local_48);
  __cxa_throw(pcVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

entry const &get_entry(string_key const &key,size_t params_no,string_key const &full_url) const
		{
			by_key_type::const_iterator kp = by_key.find(key);
			if(kp == by_key.end())
				throw cppcms_error("url_mapper: key `" + key.str() + "' not found for "
						"url `" + full_url.str() + "'");
			by_size_type::const_iterator sp = kp->second.find(params_no);
			if(sp == kp->second.end())
				throw cppcms_error("url_mapper: invalid number of parameters for " + key.str() +
						"in url `" + full_url.str() + "'");
			return sp->second;
		}